

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_server.h
# Opt level: O3

bool __thiscall blcl::net::server_interface<MsgType>::start(server_interface<MsgType> *this)

{
  executor_type *peer_io_ex;
  non_const_lvalue<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Swung0x48[P]SimpleRealTimeNetworking_NetCommon_net_server_h:47:21)>
  handler2;
  thread local_18;
  anon_class_8_1_8991fb9c_for__M_head_impl local_10;
  
  peer_io_ex = &(this->asio_acceptor_).impl_.executor_;
  local_18._M_id._M_thread = (id)(id)this;
  asio::detail::reactive_socket_service<asio::ip::tcp>::
  async_move_accept<asio::any_io_executor,blcl::net::server_interface<MsgType>::wait_for_client_connection()::_lambda(std::error_code,asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>)_1_,asio::any_io_executor>
            ((this->asio_acceptor_).impl_.service_,&(this->asio_acceptor_).impl_.implementation_,
             peer_io_ex,(endpoint_type *)0x0,(anon_class_8_1_8991fb9c *)&local_18,peer_io_ex);
  local_10.this = this;
  std::thread::thread<blcl::net::server_interface<MsgType>::start()::_lambda()_1_,,void>
            (&local_18,&local_10);
  if ((this->ctx_thread_)._M_id._M_thread == 0) {
    (this->ctx_thread_)._M_id._M_thread = (native_handle_type)local_18._M_id._M_thread;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[INFO] Server started!\n",0x17);
    return true;
  }
  std::terminate();
}

Assistant:

bool start() {
            try {
                wait_for_client_connection();
                ctx_thread_ = std::thread([this]() { context_.run(); });
            } catch (std::exception& e) {
                std::cerr << "[ERR] Exception: " << e.what() << "\n";
                return false;
            }

            std::cout << "[INFO] Server started!\n";
            return true;
        }